

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

void fctkern__final(fctkern_t *nk)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (nk != (fctkern_t *)0x0) {
    fct_clp__final(&nk->cl_parser);
    sVar3 = (nk->logger_list).used_itm_num;
    if (sVar3 != 0) {
      sVar2 = 0;
      do {
        pvVar1 = (nk->logger_list).itm_list[sVar2];
        if (pvVar1 != (void *)0x0) {
          (**(code **)((long)pvVar1 + 0x38))(pvVar1,(long)pvVar1 + 0x58);
          sVar3 = (nk->logger_list).used_itm_num;
        }
        sVar2 = sVar2 + 1;
      } while (sVar2 != sVar3);
    }
    (nk->logger_list).used_itm_num = 0;
    free((nk->logger_list).itm_list);
    if ((nk->prefix_list).used_itm_num != 0) {
      sVar3 = 0;
      do {
        free((nk->prefix_list).itm_list[sVar3]);
        sVar3 = sVar3 + 1;
      } while (sVar3 != (nk->prefix_list).used_itm_num);
    }
    (nk->prefix_list).used_itm_num = 0;
    free((nk->prefix_list).itm_list);
    fct_nlist__final(&nk->ts_list,fct_ts__del);
    return;
  }
  return;
}

Assistant:

static void
fctkern__final(fctkern_t *nk)
{
    if ( nk == NULL )
    {
        return;
    }
    fct_clp__final(&(nk->cl_parser));
    fct_nlist__final(&(nk->logger_list), (fct_nlist_on_del_t)fct_logger__del);
    /* The prefix list is a list of malloc'd strings. */
    fct_nlist__final(&(nk->prefix_list), (fct_nlist_on_del_t)free);
    fct_nlist__final(&(nk->ts_list), (fct_nlist_on_del_t)fct_ts__del);
}